

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void copy_values_for_grow_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_58;
  undefined1 local_50 [8];
  Am_Value value;
  Am_Object local_38 [3];
  Am_Object local_20;
  Am_Object widget_command;
  Am_Object widget;
  Am_Object *cmd_local;
  
  Am_Object::Am_Object(&widget_command);
  Am_Object::Am_Object(&local_20);
  Am_Object::Get_Owner((Am_Object *)&value.value,(Am_Slot_Flags)cmd);
  Am_Object::Get_Owner(local_38,(Am_Slot_Flags)&value.value);
  Am_Object::operator=(&widget_command,local_38);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_50);
  bVar1 = Am_Object::Valid(&widget_command);
  if (bVar1) {
    Am_Object::Get_Object(&local_58,(Am_Slot_Key)&widget_command,0x195);
    Am_Object::operator=(&local_20,&local_58);
    Am_Object::~Am_Object(&local_58);
    bVar1 = Am_Object::Valid(&local_20);
    if (bVar1) {
      pAVar2 = Am_Object::Peek(cmd,0x16c,0);
      Am_Value::operator=((Am_Value *)local_50,pAVar2);
      Am_Object::Set(&local_20,0x16c,(Am_Value *)local_50,0);
      pAVar2 = Am_Object::Peek(cmd,0x169,0);
      Am_Value::operator=((Am_Value *)local_50,pAVar2);
      Am_Object::Set(&local_20,0x169,(Am_Value *)local_50,0);
      pAVar2 = Am_Object::Peek(cmd,0x16d,0);
      Am_Value::operator=((Am_Value *)local_50,pAVar2);
      Am_Object::Set(&local_20,0x16d,(Am_Value *)local_50,0);
      Am_Object::Set(&local_20,0xda,true,0);
    }
  }
  Am_Value::~Am_Value((Am_Value *)local_50);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&widget_command);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, copy_values_for_grow, (Am_Object cmd))
{
  //copy from me to widget's command
  Am_Object widget, widget_command;
  widget = cmd.Get_Owner().Get_Owner();
  Am_Value value;
  if (widget.Valid()) {
    widget_command = widget.Get_Object(Am_MOVE_GROW_COMMAND);
    if (widget_command.Valid()) {
      value = cmd.Peek(Am_OLD_VALUE);
      widget_command.Set(Am_OLD_VALUE, value);
      value = cmd.Peek(Am_VALUE);
      widget_command.Set(Am_VALUE, value);
      value = cmd.Peek(Am_OBJECT_MODIFIED);
      widget_command.Set(Am_OBJECT_MODIFIED, value);

      widget_command.Set(Am_GROWING, true);
    }
  }
}